

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O3

void __thiscall pbrt::ProgressReporter::launchThread(ProgressReporter *this)

{
  bool bVar1;
  Barrier *this_00;
  pointer *__ptr;
  long *local_38;
  thread local_30;
  
  this_00 = (Barrier *)operator_new(0x60);
  (this_00->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  (this_00->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_00->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this_00->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this_00->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  std::condition_variable::condition_variable(&this_00->cv);
  this_00->numToBlock = 2;
  this_00->numToExit = 2;
  local_30._M_id._M_thread = (id)0;
  local_38 = (long *)operator_new(0x18);
  *local_38 = (long)&PTR___State_02d9d220;
  local_38[1] = (long)this;
  local_38[2] = (long)this_00;
  std::thread::_M_start_thread(&local_30,&local_38,0);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  if ((this->updateThread)._M_id._M_thread == 0) {
    (this->updateThread)._M_id._M_thread = (native_handle_type)local_30._M_id._M_thread;
    bVar1 = Barrier::Block(this_00);
    if (bVar1) {
      std::condition_variable::~condition_variable(&this_00->cv);
      operator_delete(this_00,0x60);
    }
    return;
  }
  std::terminate();
}

Assistant:

void ProgressReporter::launchThread() {
    Barrier *barrier = new Barrier(2);
    updateThread = std::thread([this, barrier]() {
#if NVTX
#ifdef PBRT_IS_WINDOWS
        nvtxNameOsThread(GetCurrentThreadId(), "PBRT_PROGRESS_BAR");
#else
        nvtxNameOsThread(syscall(SYS_gettid), "PBRT_PROGRESS_BAR");
#endif
#endif
        if (barrier->Block())
            delete barrier;
        printBar();
    });
    // Wait for the thread to get past the ProfilerWorkerThreadInit()
    // call.
    if (barrier->Block())
        delete barrier;
}